

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O1

void __thiscall t_json_generator::write_key_and_bool(t_json_generator *this,string *key,bool val)

{
  ostream *poVar1;
  t_json_generator *this_00;
  char *pcVar2;
  string local_48;
  
  write_comma_if_needed(this);
  this_00 = (t_json_generator *)&this->f_json_;
  poVar1 = t_generator::indent(&this->super_t_generator,(ostream *)this_00);
  json_str(&local_48,this_00,key);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  pcVar2 = "false";
  if (val) {
    pcVar2 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,(ulong)val ^ 5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  indicate_comma_needed(this);
  return;
}

Assistant:

void t_json_generator::write_key_and_bool(string key, bool val) {
  write_comma_if_needed();
  indent(f_json_) << json_str(key) << ": " << (val ? "true" : "false");
  indicate_comma_needed();
}